

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

Polynomial<int32_t,_double> * anon_unknown.dwarf_c9fea::GeneratePolynomialINT(void)

{
  long lVar1;
  Polynomial<int32_t,_double> *in_RDI;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<int> __l_11;
  initializer_list<int> __l_12;
  initializer_list<int> __l_13;
  allocator_type local_40f;
  allocator_type local_40e;
  allocator_type local_40d;
  allocator_type local_40c;
  allocator_type local_40b;
  allocator_type local_40a;
  allocator_type local_409;
  allocator_type local_408;
  allocator_type local_407;
  allocator_type local_406;
  allocator_type local_405;
  allocator_type local_404;
  allocator_type local_403;
  allocator_type local_402;
  allocator_type local_401;
  int local_400 [4];
  _Vector_base<int,_std::allocator<int>_> local_3f0;
  _Vector_base<int,_std::allocator<int>_> local_3d8;
  _Vector_base<int,_std::allocator<int>_> local_3c0;
  _Vector_base<int,_std::allocator<int>_> local_3a8;
  _Vector_base<int,_std::allocator<int>_> local_390;
  _Vector_base<int,_std::allocator<int>_> local_378;
  _Vector_base<int,_std::allocator<int>_> local_360;
  _Vector_base<int,_std::allocator<int>_> local_348;
  _Vector_base<int,_std::allocator<int>_> local_330;
  _Vector_base<int,_std::allocator<int>_> local_318;
  _Vector_base<int,_std::allocator<int>_> local_300;
  _Vector_base<int,_std::allocator<int>_> local_2e8;
  _Vector_base<int,_std::allocator<int>_> local_2d0;
  _Vector_base<int,_std::allocator<int>_> local_2b8;
  _Vector_base<int,_std::allocator<int>_> local_2a0;
  int local_288 [30];
  _Vector_base<int,_std::allocator<int>_> local_210;
  undefined8 local_1f8;
  vector<int,_std::allocator<int>_> local_1f0;
  undefined8 local_1d8;
  vector<int,_std::allocator<int>_> local_1d0;
  undefined1 *local_1b8;
  vector<int,_std::allocator<int>_> local_1b0;
  undefined8 local_198;
  vector<int,_std::allocator<int>_> local_190;
  undefined8 local_178;
  vector<int,_std::allocator<int>_> local_170;
  undefined8 local_158;
  vector<int,_std::allocator<int>_> local_150;
  undefined8 local_138;
  vector<int,_std::allocator<int>_> local_130;
  undefined8 local_118;
  vector<int,_std::allocator<int>_> local_110;
  undefined8 local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  undefined8 local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  undefined8 local_b8;
  vector<int,_std::allocator<int>_> local_b0;
  undefined8 local_98;
  vector<int,_std::allocator<int>_> local_90;
  undefined8 local_78;
  vector<int,_std::allocator<int>_> local_70;
  undefined8 local_58;
  vector<int,_std::allocator<int>_> local_50;
  undefined8 local_38;
  
  local_400[3] = 0xffffffff;
  __l._M_len = 1;
  __l._M_array = local_400 + 3;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2a0,__l,&local_401);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_210,
             (vector<int,_std::allocator<int>_> *)&local_2a0);
  local_1f8 = 0x3ff0000000000000;
  local_400[2] = 0xfffffffe;
  __l_00._M_len = 1;
  __l_00._M_array = local_400 + 2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2b8,__l_00,&local_402);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1f0,(vector<int,_std::allocator<int>_> *)&local_2b8);
  local_1d8 = 0x4000000000000000;
  local_400[1] = 0xfffffffd;
  __l_01._M_len = 1;
  __l_01._M_array = local_400 + 1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2d0,__l_01,&local_403);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1d0,(vector<int,_std::allocator<int>_> *)&local_2d0);
  local_1b8 = &DAT_4008000000000000;
  local_400[0] = -4;
  __l_02._M_len = 1;
  __l_02._M_array = local_400;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2e8,__l_02,&local_404);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1b0,(vector<int,_std::allocator<int>_> *)&local_2e8);
  local_198 = 0x4010000000000000;
  local_288[10] = -1;
  local_288[0xb] = -2;
  __l_03._M_len = 2;
  __l_03._M_array = local_288 + 10;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_300,__l_03,&local_405);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_190,(vector<int,_std::allocator<int>_> *)&local_300);
  local_178 = 0x4028000000000000;
  local_288[8] = -1;
  local_288[9] = -3;
  __l_04._M_len = 2;
  __l_04._M_array = local_288 + 8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_318,__l_04,&local_406);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_170,(vector<int,_std::allocator<int>_> *)&local_318);
  local_158 = 0x402a000000000000;
  local_288[6] = -1;
  local_288[7] = -4;
  __l_05._M_len = 2;
  __l_05._M_array = local_288 + 6;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_330,__l_05,&local_407);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_150,(vector<int,_std::allocator<int>_> *)&local_330);
  local_138 = 0x402c000000000000;
  local_288[4] = -2;
  local_288[5] = -3;
  __l_06._M_len = 2;
  __l_06._M_array = local_288 + 4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_348,__l_06,&local_408);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_130,(vector<int,_std::allocator<int>_> *)&local_348);
  local_118 = 0x4037000000000000;
  local_288[2] = -2;
  local_288[3] = -4;
  __l_07._M_len = 2;
  __l_07._M_array = local_288 + 2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_360,__l_07,&local_409);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_110,(vector<int,_std::allocator<int>_> *)&local_360);
  local_f8 = 0x4038000000000000;
  local_288[0] = -3;
  local_288[1] = -4;
  __l_08._M_len = 2;
  __l_08._M_array = local_288;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_378,__l_08,&local_40a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_f0,(vector<int,_std::allocator<int>_> *)&local_378);
  local_d8 = 0x4041000000000000;
  local_288[0x15] = -1;
  local_288[0x16] = -2;
  local_288[0x17] = 0xfffffffd;
  __l_09._M_len = 3;
  __l_09._M_array = local_288 + 0x15;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_390,__l_09,&local_40b);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_d0,(vector<int,_std::allocator<int>_> *)&local_390);
  local_b8 = 0x405ec00000000000;
  local_288[0x12] = -1;
  local_288[0x13] = -2;
  local_288[0x14] = 0xfffffffc;
  __l_10._M_len = 3;
  __l_10._M_array = local_288 + 0x12;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_3a8,__l_10,&local_40c);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_b0,(vector<int,_std::allocator<int>_> *)&local_3a8);
  local_98 = 0x405f000000000000;
  local_288[0xf] = -1;
  local_288[0x10] = -3;
  local_288[0x11] = 0xfffffffc;
  __l_11._M_len = 3;
  __l_11._M_array = local_288 + 0xf;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_3c0,__l_11,&local_40d);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_90,(vector<int,_std::allocator<int>_> *)&local_3c0);
  local_78 = 0x4060c00000000000;
  local_288[0xc] = -2;
  local_288[0xd] = -3;
  local_288[0xe] = 0xfffffffc;
  __l_12._M_len = 3;
  __l_12._M_array = local_288 + 0xc;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_3d8,__l_12,&local_40e);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_70,(vector<int,_std::allocator<int>_> *)&local_3d8);
  local_58 = 0x406d400000000000;
  local_288[0x18] = -1;
  local_288[0x19] = -2;
  local_288[0x1a] = -3;
  local_288[0x1b] = -4;
  __l_13._M_len = 4;
  __l_13._M_array = local_288 + 0x18;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_3f0,__l_13,&local_40f);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_50,(vector<int,_std::allocator<int>_> *)&local_3f0);
  local_38 = 0x4093480000000000;
  std::
  _Hashtable<std::vector<int,std::allocator<int>>,std::pair<std::vector<int,std::allocator<int>>const,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<int,std::allocator<int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<int,std::allocator<int>>const,double>const*>();
  lVar1 = 0x1c0;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&local_210._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3c0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_390);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_378);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_360);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_348);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_330);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_318);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_300);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a0);
  return in_RDI;
}

Assistant:

Polynomial<int32_t, double> GeneratePolynomialINT() {
   
   Polynomial<int32_t, double> polynomial {
      //linear biases
      {{-1}, 1.0}, {{-2}, 2.0}, {{-3}, 3.0}, {{-4}, 4.0},
      //quadratic biases
      {{-1, -2}, 12.0}, {{-1, -3}, 13.0}, {{-1, -4}, 14.0},
      {{-2, -3}, 23.0}, {{-2, -4}, 24.0},
      {{-3, -4}, 34.0},
      //polynomial biases
      {{-1, -2, -3}, 123.0}, {{-1, -2, -4}, 124.0}, {{-1, -3, -4}, 134.0},
      {{-2, -3, -4}, 234.0},
      {{-1, -2, -3, -4}, 1234.0}
   };
   
   return polynomial;
}